

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O2

Maybe<kj::ArrayPtr<const_char>_> *
kj::anon_unknown_0::trySplit
          (Maybe<kj::ArrayPtr<const_char>_> *__return_storage_ptr__,ArrayPtr<const_char> *text,
          char c)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  pcVar2 = text->ptr;
  sVar1 = 0;
  do {
    sVar3 = sVar1;
    if (text->size_ == sVar3) {
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    sVar1 = sVar3 + 1;
  } while (pcVar2[sVar3] != c);
  text->ptr = pcVar2 + sVar1;
  text->size_ = text->size_ - sVar1;
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.ptr = pcVar2;
  (__return_storage_ptr__->ptr).field_1.value.size_ = sVar3;
  return __return_storage_ptr__;
}

Assistant:

Maybe<ArrayPtr<const char>> trySplit(ArrayPtr<const char>& text, char c) {
  for (auto i: kj::indices(text)) {
    if (text[i] == c) {
      ArrayPtr<const char> result = text.first(i);
      text = text.slice(i + 1, text.size());
      return result;
    }
  }
  return kj::none;
}